

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationYY.hpp
# Opt level: O2

int __thiscall
qclab::qgates::RotationYY<std::complex<double>_>::toQASM
          (RotationYY<std::complex<double>_> *this,ostream *stream,int offset)

{
  int iVar1;
  int iVar2;
  double angle;
  vector<int,_std::allocator<int>_> qubits;
  __string_type local_60;
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  (*(this->super_QRotationGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject[5])(&local_40,this);
  iVar1 = *local_40._M_impl.super__Vector_impl_data._M_start;
  iVar2 = local_40._M_impl.super__Vector_impl_data._M_start[1];
  angle = QRotation<double>::theta(&(this->super_QRotationGate2<std::complex<double>_>).rotation_);
  qasmRyy<double>(&local_60,iVar1 + offset,iVar2 + offset,angle);
  std::operator<<(stream,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          auto qubits = this->qubits() ;
          stream << qasmRyy( qubits[0] + offset ,
                             qubits[1] + offset , this->theta() ) ;
          return 0 ;
        }